

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_time.c
# Opt level: O0

uint32_t unix_to_dos(int64_t unix_time)

{
  tm *ptVar1;
  undefined1 local_68 [8];
  tm tmbuf;
  time_t ut;
  uint32_t dt;
  tm *t;
  int64_t unix_time_local;
  
  tmbuf.tm_zone = (char *)unix_time;
  if (dos_initialised == '\0') {
    dos_max_unix = dos_to_unix(0xff9fbf7d);
    dos_min_unix = dos_to_unix(0x210000);
    dos_initialised = '\x01';
  }
  if (unix_time < dos_max_unix) {
    if (dos_min_unix < unix_time) {
      ptVar1 = localtime_r((time_t *)&tmbuf.tm_zone,(tm *)local_68);
      unix_time_local._4_4_ =
           ((int)(ptVar1->tm_sec & 0x3eU) >> 1) +
           (ptVar1->tm_min & 0x3fU) * 0x20 +
           (ptVar1->tm_hour & 0x1fU) * 0x800 +
           ((ptVar1->tm_mday & 0x1fU) +
           (ptVar1->tm_mon + 1U & 0xf) * 0x20 + (ptVar1->tm_year - 0x50U & 0x7f) * 0x200) * 0x10000;
    }
    else {
      unix_time_local._4_4_ = 0x210000;
    }
  }
  else {
    unix_time_local._4_4_ = 0xff9fbf7d;
  }
  return unix_time_local._4_4_;
}

Assistant:

uint32_t
unix_to_dos(int64_t unix_time)
{
	struct tm *t;
	uint32_t dt;
	time_t ut = unix_time;
#if defined(HAVE_LOCALTIME_R) || defined(HAVE_LOCALTIME_S)
	struct tm tmbuf;
#endif

	if (!dos_initialised) {
		dos_max_unix = dos_to_unix(DOS_MAX_TIME);
		dos_min_unix = dos_to_unix(DOS_MIN_TIME);
		dos_initialised = 1;
	}
	if (unix_time >= dos_max_unix) {
		return DOS_MAX_TIME;
	}
	else if(unix_time <= dos_min_unix) {
		return DOS_MIN_TIME;
	}
	else {
#if defined(HAVE_LOCALTIME_S)
		t = localtime_s(&tmbuf, &ut) ? NULL : &tmbuf;
#elif defined(HAVE_LOCALTIME_R)
		t = localtime_r(&ut, &tmbuf);
#else
		t = localtime(&ut);
#endif
		dt = 0;
		dt += ((t->tm_year - 80) & 0x7f) << 9;
		dt += ((t->tm_mon + 1) & 0x0f) << 5;
		dt += (t->tm_mday & 0x1f);
		dt <<= 16;
		dt += (t->tm_hour & 0x1f) << 11;
		dt += (t->tm_min & 0x3f) << 5;
		dt += (t->tm_sec & 0x3e) >> 1; /* Only counting every 2 seconds. */
		return dt;
	}
}